

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_hello_decode_server_name(ptls_iovec_t *name,uint8_t **src,uint8_t *end)

{
  byte *pbVar1;
  uint8_t **ppuVar2;
  long lVar3;
  void *pvVar4;
  ptls_iovec_t pVar5;
  uint8_t *local_90;
  uint8_t *local_88;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *puStack_50;
  uint8_t type;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint8_t *puStack_20;
  int ret;
  uint8_t *end_local;
  uint8_t **src_local;
  ptls_iovec_t *name_local;
  
  _block_size = 2;
  if ((ulong)((long)end - (long)*src) < 2) {
    _capacity._4_4_ = 0x32;
  }
  else {
    _block_size64 = 0;
    do {
      pbVar1 = *src;
      *src = pbVar1 + 1;
      _block_size64 = _block_size64 << 8 | (ulong)*pbVar1;
      _block_size = _block_size - 1;
    } while (_block_size != 0);
    _capacity._4_4_ = 0;
    if ((ulong)((long)end - (long)*src) < _block_size64) {
      _capacity._4_4_ = 0x32;
    }
    else {
      puStack_50 = *src + _block_size64;
      _block_size = 0;
      puStack_20 = end;
      end_local = (uint8_t *)src;
      src_local = &name->base;
      do {
        _capacity._4_4_ =
             ptls_decode8((uint8_t *)((long)&_capacity_1 + 7),(uint8_t **)end_local,puStack_50);
        if (_capacity._4_4_ != 0) {
          return _capacity._4_4_;
        }
        _block_size_1 = 2;
        if ((ulong)((long)puStack_50 - *(long *)end_local) < 2) {
          return 0x32;
        }
        _block_size64_1 = 0;
        do {
          pbVar1 = *(byte **)end_local;
          *(byte **)end_local = pbVar1 + 1;
          _block_size64_1 = _block_size64_1 << 8 | (ulong)*pbVar1;
          _block_size_1 = _block_size_1 - 1;
        } while (_block_size_1 != 0);
        if ((ulong)((long)puStack_50 - *(long *)end_local) < _block_size64_1) {
          return 0x32;
        }
        lVar3 = *(long *)end_local + _block_size64_1;
        if (_capacity_1._7_1_ == '\0') {
          pvVar4 = memchr(*(void **)end_local,0,lVar3 - *(long *)end_local);
          ppuVar2 = src_local;
          if (pvVar4 != (void *)0x0) {
            return 0x2f;
          }
          pVar5 = ptls_iovec_init(*(void **)end_local,lVar3 - *(long *)end_local);
          local_90 = pVar5.base;
          *ppuVar2 = local_90;
          local_88 = (uint8_t *)pVar5.len;
          ppuVar2[1] = local_88;
        }
        *(long *)end_local = lVar3;
        if (*(long *)end_local != lVar3) {
          return 0x32;
        }
      } while (*(uint8_t **)end_local != puStack_50);
      if (*(uint8_t **)end_local != puStack_50) {
        _capacity._4_4_ = 0x32;
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int client_hello_decode_server_name(ptls_iovec_t *name, const uint8_t **src, const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_open_block(*src, end, 2, {
        do {
            uint8_t type;
            if ((ret = ptls_decode8(&type, src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(*src, end, 2, {
                switch (type) {
                case PTLS_SERVER_NAME_TYPE_HOSTNAME:
                    if (memchr(*src, '\0', end - *src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    *name = ptls_iovec_init(*src, end - *src);
                    break;
                default:
                    break;
                }
                *src = end;
            });
        } while (*src != end);
    });

Exit:
    return ret;
}